

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Generic_Lift(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4
                   )

{
  bool bVar1;
  EPlatType local_2c;
  EPlatType type;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  switch(arg3) {
  case 1:
    local_2c = platDownWaitUpStay;
    break;
  case 2:
    local_2c = platDownToNearestFloor;
    break;
  case 3:
    local_2c = platDownToLowestCeiling;
    break;
  case 4:
    local_2c = platPerpetualRaise;
    break;
  default:
    local_2c = platUpByValue;
  }
  bVar1 = EV_DoPlat(arg0,(line_t_conflict *)ln,local_2c,(double)(arg4 << 3),(double)arg1 / 8.0,
                    (arg2 * 0x23) / 8,0,0);
  return (int)bVar1;
}

Assistant:

FUNC(LS_Generic_Lift)
// Generic_Lift (tag, speed, delay, target, height)
{
	DPlat::EPlatType type;

	switch (arg3)
	{
		case 1:
			type = DPlat::platDownWaitUpStay;
			break;
		case 2:
			type = DPlat::platDownToNearestFloor;
			break;
		case 3:
			type = DPlat::platDownToLowestCeiling;
			break;
		case 4:
			type = DPlat::platPerpetualRaise;
			break;
		default:
			type = DPlat::platUpByValue;
			break;
	}

	return EV_DoPlat (arg0, ln, type, arg4*8, SPEED(arg1), OCTICS(arg2), 0, 0);
}